

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupZeroUndc(Gia_Man_t *p,char *pInit,int nNewPis,int fGiaSimple,int fVerbose)

{
  byte bVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  void *__s;
  long lVar7;
  Gia_Man_t *p_00;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  Gia_Obj_t *pGVar11;
  long lVar12;
  Vec_Int_t *pVVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  
  iVar19 = p->nRegs;
  sVar6 = strlen(pInit);
  if (iVar19 != (int)sVar6) {
    __assert_fail("(int)strlen(pInit) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xc39,"Gia_Man_t *Gia_ManDupZeroUndc(Gia_Man_t *, char *, int, int, int)");
  }
  iVar18 = p->vCis->nSize - iVar19;
  sVar6 = (long)iVar19 * 4;
  __s = malloc(sVar6);
  memset(__s,0xff,sVar6);
  if (0 < iVar19) {
    lVar7 = 0;
    do {
      if ((byte)(pInit[lVar7] | 0x20U) == 0x78) {
        *(int *)((long)__s + lVar7 * 4) = iVar18;
        iVar18 = iVar18 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (iVar19 != lVar7);
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pName = pcVar8;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pSpec = pcVar8;
  p_00->fGiaSimple = fGiaSimple;
  p->pObjs->Value = 0;
  pVVar13 = p->vCis;
  uVar15 = pVVar13->nSize;
  uVar16 = (ulong)uVar15;
  uVar4 = uVar15 - p->nRegs;
  uVar10 = (ulong)uVar4;
  if (uVar4 != 0 && p->nRegs <= (int)uVar15) {
    lVar7 = 0;
    do {
      if ((int)uVar16 <= lVar7) goto LAB_001ec99f;
      iVar19 = pVVar13->pArray[lVar7];
      if (((long)iVar19 < 0) || (p->nObjs <= iVar19)) goto LAB_001ec980;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar11 = p_00->pObjs;
      if ((pGVar9 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar9)) goto LAB_001ec961;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar11) >> 2) * -0x55555555);
      pGVar11 = p_00->pObjs;
      if ((pGVar9 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar9)) goto LAB_001ec961;
      pGVar3[iVar19].Value = (int)((ulong)((long)pGVar9 - (long)pGVar11) >> 2) * 0x55555556;
      lVar7 = lVar7 + 1;
      pVVar13 = p->vCis;
      uVar16 = (ulong)pVVar13->nSize;
      uVar10 = uVar16 - (long)p->nRegs;
    } while (lVar7 < (long)uVar10);
  }
  iVar19 = iVar18 - (int)uVar10;
  if (iVar19 != 0 && (int)uVar10 <= iVar18) {
    do {
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar11 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar11)) goto LAB_001ec961;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * -0x55555555);
      if ((pGVar11 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar11)) goto LAB_001ec961;
      iVar19 = iVar19 + -1;
    } while (iVar19 != 0);
  }
  if (0 < nNewPis) {
    do {
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar11 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar11)) goto LAB_001ec961;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * -0x55555555);
      if ((pGVar11 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar11)) goto LAB_001ec961;
      nNewPis = nNewPis + -1;
    } while (nNewPis != 0);
  }
  iVar19 = p->nRegs;
  if (0 < iVar19) {
    iVar17 = 0;
    do {
      iVar14 = p->vCis->nSize;
      uVar15 = (iVar14 - iVar19) + iVar17;
      if (((int)uVar15 < 0) || (iVar14 <= (int)uVar15)) goto LAB_001ec99f;
      iVar14 = p->vCis->pArray[uVar15];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_001ec980;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar11 = p_00->pObjs;
      if ((pGVar9 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar9)) goto LAB_001ec961;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar11) >> 2) * -0x55555555);
      pGVar11 = p_00->pObjs;
      if ((pGVar9 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar9)) goto LAB_001ec961;
      pGVar3[iVar14].Value = (int)((ulong)((long)pGVar9 - (long)pGVar11) >> 2) * 0x55555556;
      iVar17 = iVar17 + 1;
      iVar19 = p->nRegs;
    } while (iVar17 < iVar19);
  }
  iVar17 = -1;
  if (iVar18 <= p->vCis->nSize - iVar19) {
LAB_001ec541:
    Gia_ManMarkFanoutDrivers(p);
    uVar10 = (ulong)(uint)p->nRegs;
    if (p->nRegs < 1) {
      uVar15 = 0;
    }
    else {
      lVar7 = 0;
      uVar15 = 0;
      do {
        iVar19 = p->vCis->nSize;
        uVar10 = (ulong)(uint)(iVar19 - (int)uVar10) + lVar7;
        iVar14 = (int)uVar10;
        if ((iVar14 < 0) || (iVar19 <= iVar14)) goto LAB_001ec99f;
        iVar19 = p->vCis->pArray[uVar10 & 0xffffffff];
        lVar12 = (long)iVar19;
        if ((lVar12 < 0) || (p->nObjs <= iVar19)) goto LAB_001ec980;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        bVar1 = pInit[lVar7];
        if (bVar1 < 0x58) {
          if (bVar1 != 0x30) {
            if (bVar1 != 0x31) goto LAB_001eca1b;
            if ((int)pGVar3[lVar12].Value < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            pGVar3[lVar12].Value = pGVar3[lVar12].Value ^ 1;
            uVar15 = uVar15 + 1;
          }
        }
        else {
          if ((bVar1 != 0x58) && (bVar1 != 0x78)) {
LAB_001eca1b:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                          ,0xc5f,"Gia_Man_t *Gia_ManDupZeroUndc(Gia_Man_t *, char *, int, int, int)"
                         );
          }
          if ((pGVar3[lVar12].field_0x3 & 0x40) != 0) {
            uVar4 = *(uint *)((long)__s + lVar7 * 4);
            iVar19 = p_00->vCis->nSize;
            if (iVar19 - p_00->nRegs <= (int)uVar4) {
              __assert_fail("v < Gia_ManPiNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
            }
            if (((int)uVar4 < 0) || (iVar19 <= (int)uVar4)) goto LAB_001ec99f;
            iVar19 = p_00->vCis->pArray[uVar4];
            if (((long)iVar19 < 0) || (p_00->nObjs <= iVar19)) goto LAB_001ec980;
            pGVar11 = p_00->pObjs;
            pGVar9 = (Gia_Obj_t *)((ulong)(pGVar11 + iVar19) & 0xfffffffffffffffe);
            if ((pGVar9 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar9)) goto LAB_001ec961;
            iVar14 = (int)((ulong)((long)pGVar9 - (long)pGVar11) >> 2);
            if (iVar14 * -0x55555555 < 0) {
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            uVar4 = Gia_ManAppendMux(p_00,iVar17,pGVar3[lVar12].Value,
                                     ((uint)(pGVar11 + iVar19) & 1) + iVar14 * 0x55555556);
            pGVar3[lVar12].Value = uVar4;
          }
        }
        lVar7 = lVar7 + 1;
        uVar10 = (ulong)p->nRegs;
      } while (lVar7 < (long)uVar10);
    }
    Gia_ManCleanMark0(p);
    if (__s != (void *)0x0) {
      free(__s);
    }
    if (0 < p->nObjs) {
      lVar7 = 8;
      lVar12 = 0;
      do {
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        uVar10 = *(ulong *)((long)pGVar3 + lVar7 + -8);
        if ((uVar10 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar10) {
          uVar4 = *(uint *)((long)pGVar3 +
                           lVar7 + (ulong)(uint)((int)(uVar10 & 0x1fffffff) << 2) * -3);
          if (((int)uVar4 < 0) ||
             (uVar5 = *(uint *)((long)pGVar3 +
                               lVar7 + (ulong)((uint)(uVar10 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar5 < 0)) goto LAB_001ec9be;
          iVar19 = Gia_ManAppendAnd(p_00,uVar4 ^ (uint)(uVar10 >> 0x1d) & 1,
                                    uVar5 ^ (uint)(uVar10 >> 0x3d) & 1);
          *(int *)(&pGVar3->field_0x0 + lVar7) = iVar19;
        }
        lVar12 = lVar12 + 1;
        lVar7 = lVar7 + 0xc;
      } while (lVar12 < p->nObjs);
    }
    pVVar13 = p->vCos;
    uVar10 = (ulong)(uint)pVVar13->nSize;
    if (p->nRegs < pVVar13->nSize) {
      lVar7 = 0;
      do {
        if ((int)uVar10 <= lVar7) goto LAB_001ec99f;
        iVar19 = pVVar13->pArray[lVar7];
        if (((long)iVar19 < 0) || (p->nObjs <= iVar19)) goto LAB_001ec980;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar19;
        if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0)
        goto LAB_001ec9be;
        uVar4 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                     pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].
                                     Value);
        pGVar3->Value = uVar4;
        lVar7 = lVar7 + 1;
        pVVar13 = p->vCos;
        uVar10 = (ulong)pVVar13->nSize;
      } while (lVar7 < (long)(uVar10 - (long)p->nRegs));
    }
    uVar4 = p->nRegs;
    uVar10 = (ulong)uVar4;
    if (0 < (int)uVar4) {
      lVar7 = 0;
      do {
        iVar19 = p->vCos->nSize;
        uVar4 = (uint)uVar10;
        uVar10 = (ulong)(iVar19 - uVar4) + lVar7;
        iVar17 = (int)uVar10;
        if ((iVar17 < 0) || (iVar19 <= iVar17)) {
LAB_001ec99f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar19 = p->vCos->pArray[uVar10 & 0xffffffff];
        if (((long)iVar19 < 0) || (p->nObjs <= iVar19)) {
LAB_001ec980:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar19;
        uVar5 = (uint)*(ulong *)pGVar3;
        uVar4 = pGVar3[-(ulong)(uVar5 & 0x1fffffff)].Value;
        if (pInit[lVar7] == '1') {
          if ((int)uVar4 < 0) goto LAB_001ec9be;
          uVar4 = uVar4 ^ (uint)(*(ulong *)pGVar3 >> 0x1d) & 1 ^ 1;
        }
        else {
          if ((int)uVar4 < 0) {
LAB_001ec9be:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar4 = uVar5 >> 0x1d & 1 ^ uVar4;
        }
        uVar4 = Gia_ManAppendCo(p_00,uVar4);
        pGVar3->Value = uVar4;
        lVar7 = lVar7 + 1;
        uVar4 = p->nRegs;
        uVar10 = (ulong)(int)uVar4;
      } while (lVar7 < (long)uVar10);
    }
    if ((int)(p->vCis->nSize - uVar4) < iVar18) {
      Gia_ManAppendCo(p_00,1);
    }
    Gia_ManSetRegNum(p_00,(uint)(p->vCis->nSize - p->nRegs < iVar18) + p->nRegs);
    if (fVerbose != 0) {
      printf("Converted %d 1-valued FFs and %d DC-valued FFs.\n",(ulong)uVar15,
             (ulong)(uint)((iVar18 - p->vCis->nSize) + p->nRegs));
    }
    return p_00;
  }
  pGVar11 = Gia_ManAppendObj(p_00);
  uVar10 = *(ulong *)pGVar11;
  *(ulong *)pGVar11 = uVar10 | 0x9fffffff;
  *(ulong *)pGVar11 =
       uVar10 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
  pGVar3 = p_00->pObjs;
  if ((pGVar3 <= pGVar11) && (pGVar11 < pGVar3 + p_00->nObjs)) {
    Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * -0x55555555);
    pGVar3 = p_00->pObjs;
    if ((pGVar3 <= pGVar11) && (pGVar11 < pGVar3 + p_00->nObjs)) {
      iVar17 = (int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * 0x55555556;
      goto LAB_001ec541;
    }
  }
LAB_001ec961:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupZeroUndc( Gia_Man_t * p, char * pInit, int nNewPis, int fGiaSimple, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int CountPis = Gia_ManPiNum(p), * pPiLits;
    int i, iResetFlop = -1, Count1 = 0;
    //printf( "Using %s\n", pInit );
    // map X-valued flops into new PIs
    assert( (int)strlen(pInit) == Gia_ManRegNum(p) );
    pPiLits = ABC_FALLOC( int, Gia_ManRegNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        if ( pInit[i] == 'x' || pInit[i] == 'X' )
            pPiLits[i] = CountPis++;
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->fGiaSimple = fGiaSimple;
    Gia_ManConst0(p)->Value = 0;
    // create primary inputs
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create additional primary inputs
    for ( i = Gia_ManPiNum(p); i < CountPis; i++ )
        Gia_ManAppendCi( pNew );
    // create additional primary inputs
    for ( i = 0; i < nNewPis; i++ )
        Gia_ManAppendCi( pNew );
    // create flop outputs
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create reset flop output
    if ( CountPis > Gia_ManPiNum(p) )
        iResetFlop = Gia_ManAppendCi( pNew );
    // update flop outputs
    Gia_ManMarkFanoutDrivers( p );
    Gia_ManForEachRo( p, pObj, i )
    {
        if ( pInit[i] == '1' )
            pObj->Value = Abc_LitNot(pObj->Value), Count1++;
        else if ( pInit[i] == 'x' || pInit[i] == 'X' )
        {
            if ( pObj->fMark0 ) // only add MUX if the flop has fanout
                pObj->Value = Gia_ManAppendMux( pNew, iResetFlop, pObj->Value, Gia_Obj2Lit(pNew, Gia_ManPi(pNew, pPiLits[i])) );
        }
        else if ( pInit[i] != '0' )
            assert( 0 );
    }
    Gia_ManCleanMark0( p );
    ABC_FREE( pPiLits );
    // build internal nodes
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create POs
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // create flop inputs
    Gia_ManForEachRi( p, pObj, i )
        if ( pInit[i] == '1' )
            pObj->Value = Gia_ManAppendCo( pNew, Abc_LitNot(Gia_ObjFanin0Copy(pObj)) );
        else
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // create reset flop input
    if ( CountPis > Gia_ManPiNum(p) )
        Gia_ManAppendCo( pNew, 1 );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) + (int)(CountPis > Gia_ManPiNum(p)) );
    if ( fVerbose )
        printf( "Converted %d 1-valued FFs and %d DC-valued FFs.\n", Count1, CountPis-Gia_ManPiNum(p) );
    return pNew;
}